

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O1

void rtext_senditup(_rtext *x,int action,int *widthp,int *heightp,int *indexp)

{
  char *pcVar1;
  char cVar2;
  t_text *ptVar3;
  long lVar4;
  _rtext *p_Var5;
  short sVar6;
  int iVar7;
  int iVar8;
  int offset;
  uint32_t uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  _glist *in_RAX;
  char *pcVar14;
  t_atom *ptVar15;
  long lVar16;
  char *pcVar17;
  t_symbol *ptVar18;
  short sVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  _glist *p_Var23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  int outchars_b;
  char *local_1a0;
  _rtext *local_198;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  ulong local_178;
  int *local_170;
  _glist *local_168;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int *local_150;
  int *local_148;
  ulong local_140;
  int local_138;
  int local_134;
  int local_130;
  int fontheight;
  int fontwidth;
  int guifontsize;
  int newindex;
  int newheight;
  int newwidth;
  char *local_110;
  char *local_108;
  char smallbuf [200];
  
  outchars_b = 0;
  local_170 = indexp;
  local_168 = glist_getcanvas(in_RAX);
  text_getfont(x->x_text,x->x_glist,&fontwidth,&fontheight,&guifontsize);
  if (x->x_bufsize < 100) {
    pcVar14 = smallbuf;
  }
  else {
    pcVar14 = (char *)getbytes((ulong)(uint)x->x_bufsize * 2 + 1);
  }
  *pcVar14 = '\0';
  ptVar3 = x->x_text;
  uVar24 = (ulong)(uint)fontheight;
  local_18c = fontwidth;
  local_1a0 = pcVar14;
  local_198 = x;
  local_190 = action;
  local_148 = widthp;
  if ((~ptVar3->field_0x2e & 3) != 0) {
    local_138 = (int)ptVar3->te_width;
    local_158 = 0x3c;
    if (ptVar3->te_width != 0) {
      local_158 = local_138;
    }
    iVar10 = u8_charnum(x->x_buf,x->x_bufsize);
    local_134 = (local_18c / 2 + *widthp) / local_18c;
    local_130 = *heightp / fontheight;
    if (iVar10 < 1) {
      bVar27 = true;
      local_188 = 0;
      local_184 = 0;
      iVar7 = 0;
      local_17c = 0;
    }
    else {
      local_188 = 0;
      local_184 = 0;
      iVar12 = 0;
      uVar22 = 0;
      iVar8 = 0;
      local_17c = 0;
      iVar7 = 0;
      local_160 = 0;
      local_178 = uVar24;
      local_15c = iVar10;
      local_150 = heightp;
      do {
        p_Var5 = local_198;
        iVar13 = local_158;
        if (iVar10 < local_158) {
          iVar13 = iVar10;
        }
        local_180 = local_198->x_bufsize;
        lVar16 = (long)(int)uVar22;
        local_154 = iVar7;
        local_140 = uVar22;
        offset = u8_offset(local_198->x_buf + lVar16,iVar13);
        pcVar14 = p_Var5->x_buf + lVar16;
        iVar7 = -1;
        if (offset != 0) {
          lVar20 = 0;
          do {
            if (pcVar14[lVar20] == '\n') {
              iVar7 = (int)lVar20;
              break;
            }
            lVar20 = lVar20 + 1;
          } while (offset != lVar20);
        }
        if (iVar7 < 0) {
          iVar21 = 0;
          if (local_158 < iVar10) {
            lVar20 = (long)(offset + 1);
            do {
              if (lVar20 == 0) {
                lVar26 = 0xffffffff;
                break;
              }
              lVar26 = lVar20 + -1;
              lVar4 = lVar20 + lVar16 + -1;
              lVar20 = lVar26;
            } while (p_Var5->x_buf[lVar4] != ' ');
            iVar10 = iVar13;
            iVar7 = (int)lVar26;
            if (-1 < (int)lVar26) goto LAB_0015387c;
          }
          else {
            offset = local_180 - (int)local_140;
          }
        }
        else {
LAB_0015387c:
          offset = iVar7;
          iVar10 = u8_charnum(pcVar14,offset);
          iVar21 = 1;
        }
        p_Var5 = local_198;
        local_180 = iVar21;
        if (local_17c == local_130) {
          iVar7 = iVar10;
          if (local_134 < iVar10) {
            iVar7 = local_134;
          }
          if (local_134 < 0) {
            iVar7 = 0;
          }
          iVar7 = u8_offset(local_198->x_buf + lVar16,iVar7);
          *local_170 = iVar7 + (int)local_140;
          local_160 = 1;
        }
        strncpy(local_1a0 + outchars_b,p_Var5->x_buf + lVar16,(long)offset);
        iVar7 = p_Var5->x_selstart;
        iVar13 = (int)local_140;
        if ((iVar13 <= iVar7) && (iVar7 <= iVar13 + offset + local_180)) {
          local_188 = iVar7 + iVar12 + outchars_b;
        }
        iVar7 = p_Var5->x_selend;
        if ((iVar13 <= iVar7) && (iVar7 <= iVar13 + offset + local_180)) {
          local_184 = iVar7 + iVar12 + outchars_b;
        }
        lVar16 = (long)outchars_b + (long)offset;
        outchars_b = (int)lVar16;
        uVar11 = iVar13 + offset + local_180;
        uVar22 = (ulong)uVar11;
        if ((int)uVar11 < p_Var5->x_bufsize) {
          outchars_b = outchars_b + 1;
          local_1a0[lVar16] = '\n';
        }
        iVar8 = iVar8 + local_180 + iVar10;
        iVar7 = local_154;
        if (local_154 < iVar10) {
          iVar7 = iVar10;
        }
        local_17c = local_17c + 1;
        iVar12 = -uVar11;
        iVar10 = local_15c - iVar8;
      } while (iVar10 != 0 && iVar8 <= local_15c);
      bVar27 = local_160 == 0;
      fontheight = (int)local_178;
      pcVar14 = local_1a0;
      heightp = local_150;
      x = local_198;
      widthp = local_148;
      action = local_190;
    }
    if (bVar27) {
      *local_170 = outchars_b;
    }
    iVar10 = local_138;
    if (((short)local_138 == 0) &&
       (iVar10 = iVar7, iVar7 < (int)((uint)((x->x_text->field_0x2e & 3) != 0) * 2 + 1))) {
      do {
        lVar16 = (long)outchars_b;
        outchars_b = outchars_b + 1;
        pcVar14[lVar16] = ' ';
        iVar10 = iVar10 + 1;
      } while (iVar10 < (int)((uint)((x->x_text->field_0x2e & 3) != 0) * 2 + 1));
    }
    *widthp = iVar10 * local_18c;
    *heightp = (local_17c + (uint)(local_17c == 0)) * fontheight;
    iVar10 = glist_getzoom(x->x_glist);
    if (iVar10 < 2) {
      *widthp = *widthp + 4;
      iVar10 = *heightp + 5;
    }
    else {
      iVar10 = glist_getzoom(x->x_glist);
      *widthp = *widthp + iVar10 * 4;
      iVar10 = glist_getzoom(x->x_glist);
      iVar10 = iVar10 * 5 + *heightp;
    }
    goto LAB_00153c73;
  }
  iVar10 = *widthp;
  *local_170 = 0;
  if (((ptVar3->te_width < 1) || (iVar7 = binbuf_getnatom(ptVar3->te_binbuf), iVar7 != 1)) ||
     (ptVar15 = binbuf_getvec(x->x_text->te_binbuf), pcVar14 = local_1a0, ptVar15->a_type != A_FLOAT
     )) {
LAB_00153a1b:
    sVar19 = (short)*(undefined4 *)&x->x_text->te_width;
    sVar6 = 1000;
    if (0 < sVar19) {
      sVar6 = sVar19;
    }
    outchars_b = 0;
    if (x->x_bufsize < 1) {
      uVar11 = 0;
      iVar10 = fontheight;
    }
    else {
      uVar25 = 1;
      local_178 = uVar24;
      local_150 = heightp;
      while( true ) {
        iVar7 = outchars_b;
        uVar11 = uVar25 - 1;
        uVar9 = u8_nextchar(local_198->x_buf,&outchars_b);
        p_Var5 = local_198;
        if ((int)uVar11 < iVar10 / fontwidth) {
          *local_170 = outchars_b;
        }
        if ((uVar9 == 10) || (uVar9 == 0)) break;
        lVar16 = (long)iVar7;
        pcVar14 = local_1a0 + lVar16;
        memcpy(pcVar14,local_198->x_buf + lVar16,outchars_b - lVar16);
        if ((int)sVar6 == uVar25) {
          if ((outchars_b < p_Var5->x_bufsize) &&
             (outchars_b + 1 < p_Var5->x_bufsize || p_Var5->x_buf[outchars_b] != ' ')) {
            *pcVar14 = '>';
          }
        }
        uVar11 = uVar25;
        iVar7 = outchars_b;
        if ((p_Var5->x_bufsize <= outchars_b) ||
           (bVar27 = (int)sVar6 <= (int)uVar25, uVar25 = uVar25 + 1, bVar27)) break;
      }
      outchars_b = iVar7;
      heightp = local_150;
      x = local_198;
      iVar10 = (int)local_178;
    }
    uVar25 = 3;
    if (3 < uVar11) {
      uVar25 = uVar11;
    }
    sVar6 = x->x_text->te_width;
    if (0 < sVar6) {
      uVar25 = (int)sVar6;
    }
    *local_148 = uVar25 * local_18c;
    local_1a0[outchars_b] = '\0';
    widthp = local_148;
  }
  else {
    iVar7 = x->x_bufsize;
    iVar8 = (int)x->x_text->te_width;
    if (iVar7 <= iVar8) goto LAB_00153a1b;
    local_198 = (_rtext *)CONCAT44(local_198._4_4_,iVar8);
    local_178 = uVar24;
    strncpy(local_1a0,x->x_buf,(long)iVar7);
    pcVar14[x->x_bufsize] = '\0';
    lVar16 = (long)x->x_bufsize;
    bVar27 = 0 < lVar16;
    if (lVar16 < 1) {
LAB_0015373b:
      local_1a0[(long)x->x_text->te_width + -1] = '>';
      local_1a0[x->x_text->te_width] = '\0';
    }
    else {
      pcVar17 = local_1a0 + lVar16;
      cVar2 = *local_1a0;
      pcVar14 = local_1a0;
      while (cVar2 != '.') {
        pcVar14 = pcVar14 + 1;
        bVar27 = pcVar14 < pcVar17;
        if (!bVar27) goto LAB_0015373b;
        cVar2 = *pcVar14;
      }
      if (!bVar27) goto LAB_0015373b;
      lVar16 = 0;
      do {
        lVar20 = lVar16;
        pcVar1 = pcVar14 + lVar20 + 1;
        if (pcVar17 <= pcVar1) break;
        lVar16 = lVar20 + 1;
      } while (0xf5 < (byte)(*pcVar1 - 0x3aU));
      if (lVar20 < iVar7 - (int)local_198) goto LAB_0015373b;
      if (pcVar1 < pcVar17) {
        pcVar14 = pcVar14 + lVar20 + 1;
        do {
          pcVar14[-(long)(iVar7 - (int)local_198)] = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while (pcVar14 < pcVar17);
      }
    }
    outchars_b = (int)x->x_text->te_width;
    *local_170 = iVar10 / fontwidth;
    *widthp = local_18c * outchars_b;
    iVar10 = (int)local_178;
  }
  action = local_190;
  pcVar14 = local_1a0;
  if (outchars_b < *local_170) {
    *local_170 = outchars_b;
  }
  if (*local_170 < 0) {
    *local_170 = 0;
  }
  local_188 = x->x_selstart;
  local_184 = x->x_selend;
  iVar7 = glist_getzoom(x->x_glist);
  *widthp = *widthp + iVar7 * 2;
  iVar7 = glist_getzoom(x->x_glist);
  iVar10 = iVar10 + iVar7 * 4;
LAB_00153c73:
  *heightp = iVar10;
  pcVar14[outchars_b] = '\0';
  if (action == 0) {
    action = 0;
  }
  else {
    ptVar3 = x->x_text;
    sVar6 = ptVar3->te_width;
    if ((sVar6 != 0) && ((~ptVar3->field_0x2e & 3) != 0)) {
      _newwidth = (char *)((ulong)_newwidth & 0xffffffff00000000);
      newheight = 0;
      newindex = 0;
      ptVar3->te_width = 0;
      rtext_senditup(x,0,&newwidth,&newheight,&newindex);
      action = local_190;
      if (newwidth != *widthp) {
        x->x_text->te_width = sVar6;
      }
    }
    if ((local_168->field_0xe8 & 1) == 0) {
      action = 0;
    }
  }
  if (action == 2) {
    pcVar17 = x->x_tag;
    pdgui_vmess("pdtk_text_set","cs s",local_168,pcVar17,pcVar14);
    if ((*widthp != x->x_drawnwidth) || (*heightp != x->x_drawnheight)) {
      text_drawborder(x->x_text,x->x_glist,pcVar17,*widthp,*heightp,0);
    }
    p_Var23 = local_168;
    iVar7 = local_184;
    iVar10 = local_188;
    if (x->x_active != 0) {
      if (local_188 < local_184) {
        uVar11 = u8_charnum(x->x_buf,local_188);
        p_Var23 = local_168;
        pdgui_vmess((char *)0x0,"crr si",local_168,"select","from",pcVar17,(ulong)uVar11);
        iVar10 = u8_charnum(x->x_buf,iVar7);
        pdgui_vmess((char *)0x0,"crr si",p_Var23,"select","to",pcVar17,(ulong)(iVar10 - 1));
        pcVar17 = "";
      }
      else {
        pdgui_vmess((char *)0x0,"crr",local_168,"select","clear");
        uVar11 = u8_charnum(x->x_buf,iVar10);
        pdgui_vmess((char *)0x0,"cr si",p_Var23,"icursor",pcVar17,(ulong)uVar11);
        pdgui_vmess("focus","c",p_Var23);
      }
      pdgui_vmess((char *)0x0,"crs",p_Var23,"focus",pcVar17);
      pcVar14 = local_1a0;
      widthp = local_148;
    }
  }
  else if (action == 1) {
    _newwidth = x->x_tag;
    ptVar18 = gensym(&DAT_001b2218 +
                     *(int *)(&DAT_001b2218 + (ulong)((byte)x->x_text->field_0x2e & 3) * 4));
    local_110 = ptVar18->s_name;
    local_108 = "text";
    iVar10 = glist_getzoom(x->x_glist);
    if (iVar10 < 2) {
      iVar10 = 3;
      iVar7 = 2;
    }
    else {
      iVar7 = glist_getzoom(x->x_glist);
      iVar7 = iVar7 * 2;
      iVar10 = glist_getzoom(x->x_glist);
      iVar10 = iVar10 * 3;
    }
    iVar8 = text_xpix(x->x_text,x->x_glist);
    iVar12 = text_ypix(x->x_text,x->x_glist);
    iVar13 = glist_isselected(x->x_glist,&x->x_text->te_g);
    pcVar14 = local_1a0;
    pcVar17 = "blue";
    if (iVar13 == 0) {
      pcVar17 = "black";
    }
    pdgui_vmess("pdtk_text_new","c S ii s i r",local_168,3,&newwidth,(ulong)(uint)(iVar7 + iVar8),
                (ulong)(uint)(iVar12 + iVar10),local_1a0,(ulong)(uint)guifontsize,pcVar17);
  }
  x->x_drawnwidth = *widthp;
  x->x_drawnheight = *heightp;
  if (pcVar14 != smallbuf) {
    freebytes(pcVar14,(long)x->x_bufsize * 2 + 1);
  }
  return;
}

Assistant:

static void rtext_senditup(t_rtext *x, int action, int *widthp, int *heightp,
    int *indexp)
{
    char smallbuf[200], *tempbuf;
    int outchars_b = 0, guifontsize, fontwidth, fontheight;
    t_canvas *canvas = glist_getcanvas(x->x_glist);
    int selstart_b, selend_b;   /* beginning and end of selection in bytes */
        /* if we're a GOP (the new, "goprect" style) borrow the font size
        from the inside to preserve the spacing */

    text_getfont(x->x_text, x->x_glist, &fontwidth, &fontheight, &guifontsize);
    if (x->x_bufsize >= 100)
         tempbuf = (char *)t_getbytes(2 * x->x_bufsize + 1);
    else tempbuf = smallbuf;
    tempbuf[0] = 0;

    if (x->x_text->te_type == T_ATOM)
        rtext_formatatom(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b,  &selend_b,
            fontwidth, fontheight);
    else rtext_formattext(x, widthp, heightp, indexp,
            tempbuf, &outchars_b, &selstart_b, &selend_b,
            fontwidth, fontheight);
    tempbuf[outchars_b]=0;

    if (action && x->x_text->te_width && x->x_text->te_type != T_ATOM)
    {
            /* if our width is specified but the "natural" width is the
            same as the specified width, set specified width to zero
            so future text editing will automatically change width.
            Except atoms whose content changes at runtime. */
        int widthwas = x->x_text->te_width, newwidth = 0, newheight = 0,
            newindex = 0;
        x->x_text->te_width = 0;
        rtext_senditup(x, 0, &newwidth, &newheight, &newindex);
        if (newwidth != *widthp)
            x->x_text->te_width = widthwas;
    }

    if (action && !canvas->gl_havewindow)
        action = 0;

    if (action == SEND_FIRST)
    {
        const char *tags[] = {x->x_tag, rtext_gettype(x)->s_name, "text"};
        int lmargin = LMARGIN, tmargin = TMARGIN;
        if (glist_getzoom(x->x_glist) > 1)
        {
            /* zoom margins */
            lmargin *= glist_getzoom(x->x_glist);
            tmargin *= glist_getzoom(x->x_glist);
        }
            /* we add an extra space to the string just in case the last
            character is an unescaped backslash ('\') which would have confused
            tcl/tk by escaping the close brace otherwise.  The GUI code
            drops the last character in the string. */
        pdgui_vmess("pdtk_text_new", "c S ii s i r",
            canvas,
            3, tags,
            text_xpix(x->x_text, x->x_glist) + lmargin, text_ypix(x->x_text, x->x_glist) + tmargin,
            tempbuf,
            guifontsize,
            (glist_isselected(x->x_glist, &x->x_text->te_g)? "blue" : "black"));
    }
    else if (action == SEND_UPDATE)
    {
        pdgui_vmess("pdtk_text_set", "cs s",
                  canvas, x->x_tag,
                  tempbuf);
        if (*widthp != x->x_drawnwidth || *heightp != x->x_drawnheight)
            text_drawborder(x->x_text, x->x_glist, x->x_tag,
                *widthp, *heightp, 0);
        if (x->x_active)
        {
            if (selend_b > selstart_b)
            {
                pdgui_vmess(0, "crr si",
                    canvas, "select", "from",
                    x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess(0, "crr si",
                    canvas, "select", "to",
                    x->x_tag, u8_charnum(x->x_buf, selend_b) - 1);
                pdgui_vmess(0, "crs", canvas, "focus", "");
            }
            else
            {
                pdgui_vmess(0, "crr", canvas, "select", "clear");
                pdgui_vmess(0, "cr si", canvas, "icursor", x->x_tag, u8_charnum(x->x_buf, selstart_b));
                pdgui_vmess("focus", "c", canvas);
                pdgui_vmess(0, "crs", canvas, "focus", x->x_tag);
            }
        }
    }
    x->x_drawnwidth = *widthp;
    x->x_drawnheight = *heightp;

    if (tempbuf != smallbuf)
        t_freebytes(tempbuf, 2 * x->x_bufsize + 1);
}